

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

prf_state_t * prf_state_clone(prf_state_t *original)

{
  int iVar1;
  int iVar2;
  prf_node_t **pppVar3;
  void *elem;
  matrix4x4_f32_t **ppaafVar4;
  undefined8 *in_RDI;
  matrix4x4_f32_t *m;
  int i;
  int cnt;
  prf_state_t *clone;
  undefined4 in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int iVar5;
  int iVar6;
  prf_state_t *local_8;
  
  local_8 = prf_state_create();
  if (local_8 == (prf_state_t *)0x0) {
    local_8 = (prf_state_t *)0x0;
  }
  else {
    local_8->model = (prf_model_t *)*in_RDI;
    local_8->node = (prf_node_t *)in_RDI[1];
    local_8->header = (prf_node_t *)in_RDI[2];
    local_8->vertex_palette = (prf_node_t *)in_RDI[3];
    local_8->object_transparency = *(uint16_t *)((long)in_RDI + 0x74);
    local_8->object_flags = *(uint32_t *)(in_RDI + 0xe);
    local_8->color_palette = (prf_node_t *)in_RDI[4];
    local_8->material_palette = (prf_node_t *)in_RDI[5];
    iVar1 = prf_array_count((void *)0x1063a3);
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      pppVar3 = (prf_node_t **)
                prf_array_append_ptr((void *)CONCAT44(iVar1,iVar5),in_stack_ffffffffffffffd8);
      local_8->materials = pppVar3;
    }
    iVar1 = prf_array_count((void *)0x106400);
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      pppVar3 = (prf_node_t **)
                prf_array_append_ptr((void *)CONCAT44(iVar1,iVar5),in_stack_ffffffffffffffd8);
      local_8->textures = pppVar3;
    }
    iVar1 = prf_array_count((void *)0x10645d);
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      pppVar3 = (prf_node_t **)
                prf_array_append_ptr((void *)CONCAT44(iVar1,iVar5),in_stack_ffffffffffffffd8);
      local_8->instances = pppVar3;
    }
    iVar5 = 0;
    while (iVar5 <= (int)(uint)*(ushort *)((long)in_RDI + 0x7e)) {
      iVar6 = iVar5;
      iVar2 = prf_array_count((void *)0x1064df);
      if (iVar2 <= iVar5) {
        elem = malloc(0x40);
        if (elem == (void *)0x0) {
          prf_state_destroy((prf_state_t *)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
          return (prf_state_t *)0x0;
        }
        ppaafVar4 = (matrix4x4_f32_t **)prf_array_append_ptr((void *)CONCAT44(iVar1,iVar6),elem);
        local_8->matrix = ppaafVar4;
      }
      memcpy(local_8->matrix[iVar6],*(void **)(in_RDI[9] + (long)iVar6 * 8),0x40);
      iVar5 = iVar6 + 1;
    }
    local_8->inv_dirty = *(bool_t *)(in_RDI + 0xb);
    if (local_8->inv_dirty == 0) {
      memcpy(local_8->inv_matrix,(void *)in_RDI[10],0x40);
    }
    local_8->push_level = *(uint16_t *)((long)in_RDI + 0x76);
    local_8->subface_level = *(uint16_t *)(in_RDI + 0xf);
    local_8->extension_level = *(uint16_t *)((long)in_RDI + 0x7c);
    local_8->attribute_level = *(uint16_t *)((long)in_RDI + 0x7a);
    local_8->state_push_level = *(uint16_t *)((long)in_RDI + 0x7e);
    local_8->physical_level = *(uint16_t *)(in_RDI + 0x10);
  }
  return local_8;
}

Assistant:

prf_state_t *
prf_state_clone(
    prf_state_t * original )
{
    prf_state_t * clone;
    int cnt, i;

    assert( original != NULL );

    clone = prf_state_create();
    if ( clone == NULL )
        return NULL;
    clone->model = original->model;
    clone->node = original->node;
    clone->header = original->header;
    clone->vertex_palette = original->vertex_palette;
    clone->object_transparency = original->object_transparency;
    clone->object_flags = original->object_flags;
    clone->color_palette = original->color_palette;
    clone->material_palette = original->material_palette;
    cnt = prf_array_count( original->materials );
    for ( i = 0; i < cnt; i++ )
      clone->materials = (prf_node_t **)
	prf_array_append_ptr( clone->materials, original->materials[i] );
    cnt = prf_array_count( original->textures );
    for ( i = 0; i < cnt; i++ )
      clone->textures = (prf_node_t **) 
	prf_array_append_ptr( clone->textures, original->textures[i] );

    cnt = prf_array_count( original->instances );
    for ( i = 0; i < cnt; i++ )
      clone->instances = (prf_node_t **)
	prf_array_append_ptr( clone->instances, original->instances[i] );

    for ( i = 0; i <= original->state_push_level; i++ ) {
        if ( i >= prf_array_count( clone->matrix ) ) {
            matrix4x4_f32_t * m;
            m = (matrix4x4_f32_t *)malloc( sizeof( matrix4x4_f32_t ) );
            if ( m == NULL ) {
                prf_state_destroy( clone );
                return NULL;
            }
            clone->matrix = 
	      (matrix4x4_f32_t **)prf_array_append_ptr( clone->matrix, m );
        }
        memcpy( clone->matrix[i], original->matrix[i],
            sizeof( matrix4x4_f32_t ) );
    }

    clone->inv_dirty = original->inv_dirty;
    if ( clone->inv_dirty == FALSE )
        memcpy( clone->inv_matrix, original->inv_matrix,
            sizeof( matrix4x4_f32_t ) );

    clone->push_level = original->push_level;
    clone->subface_level = original->subface_level;
    clone->extension_level = original->extension_level;
    clone->attribute_level = original->attribute_level;

    clone->state_push_level = original->state_push_level;
    clone->physical_level = original->physical_level;

    return clone;
}